

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialaddress.cpp
# Opt level: O2

void __thiscall
ElementsConfidentialAddress_P2wshAddressFromString_Test::
~ElementsConfidentialAddress_P2wshAddressFromString_Test
          (ElementsConfidentialAddress_P2wshAddressFromString_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ElementsConfidentialAddress, P2wshAddressFromString) {
  ElementsConfidentialAddress address;

  EXPECT_NO_THROW(
      (address =
          ElementsConfidentialAddress(
              "el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz")));
  EXPECT_STREQ(
      "el1qqw3e3mk4ng3ks43mh54udznuekaadh9lgwef3mwgzrfzakmdwcvqqve2xzutyaf7vjcap67f28q90uxec2ve95g3rpu5crapcmfr2l9xl5jzazvcpysz",
      address.GetAddress().c_str());
  EXPECT_STREQ(
      "03a398eed59a2368563bbd2bc68a7ccdbbd6dcbf43b298edc810d22edb6d761800",
      address.GetConfidentialKey().GetHex().c_str());
  EXPECT_STREQ("332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("ert1qxv4rpw9jw5lxfvwsa0y4rszh7rvu9xvj6yg3s72vp7sud5340jnquagp6g",
               address.GetUnblindedAddress().GetAddress().c_str());
  EXPECT_TRUE(
      ElementsConfidentialAddress::IsConfidentialAddress(address.GetAddress()));
  EXPECT_EQ(ElementsNetType::kElementsRegtest, address.GetNetType());
  EXPECT_EQ(ElementsAddressType::kP2wshAddress, address.GetAddressType());
  EXPECT_STREQ("0020332a30b8b2753e64b1d0ebc951c057f0d9c29992d11118794c0fa1c6d2357ca6",
               address.GetLockingScript().GetHex().c_str());
}